

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void * stb__alloc_chunk(stb__alloc *src,int size,int align,int pre_align)

{
  int *piVar1;
  int iVar2;
  stb__chunk *psVar3;
  void *pvVar4;
  size_t __size;
  int iVar5;
  stb__chunk *c;
  
  psVar3 = src->chunks;
  c = (stb__chunk *)((long)&psVar3[-1].alloc + 2);
  if (size <= stb_alloc_chunk_size) {
    pvVar4 = stb__try_chunk(c,size,align,pre_align);
    if (pvVar4 != (void *)0x0) {
LAB_0015a739:
      piVar1 = (int *)((long)&psVar3->data_left + 2);
      *piVar1 = *piVar1 + 1;
      return pvVar4;
    }
    if (c->next != (stb__chunk *)0x0) {
      pvVar4 = stb__try_chunk(c->next,size,align,pre_align);
      if (pvVar4 != (void *)0x0) goto LAB_0015a739;
      stb__sort_chunks(src);
      c = (stb__chunk *)((long)&src->chunks[-1].alloc + 2);
    }
  }
  if (pre_align != 0) {
    __assert_fail("sizeof(*n) + pre_align <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xaa0,"void *stb__alloc_chunk(stb__alloc *, int, int, int)");
  }
  iVar2 = stb_alloc_chunk_size;
  if (stb_alloc_chunk_size <= size) {
    iVar2 = size;
  }
  iVar5 = iVar2 + -0x10;
  __size = (long)iVar2 + 0x10;
  while( true ) {
    psVar3 = (stb__chunk *)malloc(__size);
    if (psVar3 == (stb__chunk *)0x0) {
      return (void *)0x0;
    }
    psVar3->data_left = iVar5;
    pvVar4 = stb__try_chunk(psVar3,size,align,0);
    if (pvVar4 != (void *)0x0) break;
    free(psVar3);
    iVar5 = iVar5 + align + 0x10;
    __size = __size + (long)(align + 0x10);
  }
  psVar3->next = c;
  src->chunks = (stb__chunk *)((long)&psVar3->next + 2);
  psVar3->alloc = 1;
  if (iVar5 - size != -0x10) {
    return pvVar4;
  }
  stb__sort_chunks(src);
  return pvVar4;
}

Assistant:

static void * stb__alloc_chunk(stb__alloc *src, int size, int align, int pre_align)
{
   void *p;
   stb__chunk *c = stb__chunks(src);

   if (c && size <= stb_alloc_chunk_size) {

      p = stb__try_chunk(c, size, align, pre_align);
      if (p) { ++c->alloc; return p; }

      // try a second chunk to reduce wastage
      if (c->next) {
         p = stb__try_chunk(c->next, size, align, pre_align);
         if (p) { ++c->alloc; return p; }
   
         // put the bigger chunk first, since the second will get buried
         // the upshot of this is that, until it gets allocated from, chunk #2
         // is always the largest remaining chunk. (could formalize
         // this with a heap!)
         stb__sort_chunks(src);
         c = stb__chunks(src);
      }
   }

   // allocate a new chunk
   {
      stb__chunk *n;

      int chunk_size = stb_alloc_chunk_size;
      // we're going to allocate a new chunk to put this in
      if (size > chunk_size)
         chunk_size = size;

      assert(sizeof(*n) + pre_align <= 16);

      // loop trying to allocate a large enough chunk
      // the loop is because the alignment may cause problems if it's big...
      // and we don't know what our chunk alignment is going to be
      while (1) {
         n = (stb__chunk *) malloc(16 + chunk_size);
         if (n == NULL) return NULL;

         n->data_left = chunk_size - sizeof(*n);

         p = stb__try_chunk(n, size, align, pre_align);
         if (p != NULL) {
            n->next = c;
            stb__setchunks(src, n);

            // if we just used up the whole block immediately,
            // move the following chunk up
            n->alloc = 1;
            if (size == chunk_size)
               stb__sort_chunks(src);

            return p;
         }

         free(n);
         chunk_size += 16+align;
      }
   }
}